

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::ConstructComment_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmCustomCommandGenerator *ccg,
          char *default_comment)

{
  bool bVar1;
  char *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  allocator<char> local_89;
  string local_88;
  string *local_68;
  string *o;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  char *sep;
  allocator<char> local_29;
  char *local_28;
  char *default_comment_local;
  cmCustomCommandGenerator *ccg_local;
  cmLocalGenerator *this_local;
  string *comment;
  
  local_28 = default_comment;
  default_comment_local = (char *)ccg;
  ccg_local = (cmCustomCommandGenerator *)this;
  this_local = (cmLocalGenerator *)__return_storage_ptr__;
  pcVar2 = cmCustomCommandGenerator::GetComment(ccg);
  if (pcVar2 == (char *)0x0) {
    pvVar3 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                       ((cmCustomCommandGenerator *)default_comment_local);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(pvVar3);
    pcVar2 = local_28;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar2,&local_89);
      std::allocator<char>::~allocator(&local_89);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Generating ");
      __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0xd97e77;
      pvVar3 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                         ((cmCustomCommandGenerator *)default_comment_local);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar3);
      o = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(pvVar3);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&o), bVar1) {
        local_68 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)__range2);
        cmOutputConverter::MaybeRelativeToCurBinDir
                  (&local_88,&this->super_cmOutputConverter,local_68);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0xd4ae95;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
    }
  }
  else {
    pcVar2 = cmCustomCommandGenerator::GetComment((cmCustomCommandGenerator *)default_comment_local)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar2,&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::ConstructComment(
  cmCustomCommandGenerator const& ccg, const char* default_comment) const
{
  // Check for a comment provided with the command.
  if (ccg.GetComment()) {
    return ccg.GetComment();
  }

  // Construct a reasonable default comment if possible.
  if (!ccg.GetOutputs().empty()) {
    std::string comment;
    comment = "Generating ";
    const char* sep = "";
    for (std::string const& o : ccg.GetOutputs()) {
      comment += sep;
      comment += this->MaybeRelativeToCurBinDir(o);
      sep = ", ";
    }
    return comment;
  }

  // Otherwise use the provided default.
  return default_comment;
}